

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOut
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset,
          Script *locking_script,ConfidentialNonce *nonce)

{
  uint32_t uVar1;
  ByteData local_60;
  ByteData local_48;
  ConfidentialNonce *local_30;
  ConfidentialNonce *nonce_local;
  Script *locking_script_local;
  ConfidentialAssetId *asset_local;
  Amount *value_local;
  ConfidentialTransaction *this_local;
  
  local_30 = nonce;
  nonce_local = (ConfidentialNonce *)locking_script;
  locking_script_local = (Script *)asset;
  asset_local = (ConfidentialAssetId *)value;
  value_local = (Amount *)this;
  ByteData::ByteData(&local_48);
  ByteData::ByteData(&local_60);
  uVar1 = AddTxOut(this,value,asset,locking_script,nonce,&local_48,&local_60);
  ByteData::~ByteData((ByteData *)0x4ad99f);
  ByteData::~ByteData((ByteData *)0x4ad9a8);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOut(
    const Amount &value, const ConfidentialAssetId &asset,
    const Script &locking_script, const ConfidentialNonce &nonce) {
  return AddTxOut(value, asset, locking_script, nonce, ByteData(), ByteData());
}